

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O0

void pbrt::
     LogFatal<char_const(&)[17],char_const(&)[18],char_const(&)[17],unsigned_long&,char_const(&)[18],unsigned_long&>
               (LogLevel level,char *file,int line,char *fmt,char (*args) [17],char (*args_1) [18],
               char (*args_2) [17],unsigned_long *args_3,char (*args_4) [18],unsigned_long *args_5)

{
  char (*in_RCX) [18];
  undefined4 in_EDX;
  char *in_stack_00000018;
  int in_stack_00000024;
  char *in_stack_00000028;
  LogLevel in_stack_00000034;
  string s;
  unsigned_long *in_stack_ffffffffffffffa8;
  char (*in_stack_ffffffffffffffb0) [17];
  char (*in_stack_ffffffffffffffb8) [18];
  char (*in_stack_ffffffffffffffc0) [17];
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe8;
  
  StringPrintf<char_const(&)[17],char_const(&)[18],char_const(&)[17],unsigned_long&,char_const(&)[18],unsigned_long&>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RCX,
             (unsigned_long *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  std::__cxx11::string::c_str();
  LogFatal(in_stack_00000034,in_stack_00000028,in_stack_00000024,in_stack_00000018);
}

Assistant:

inline void LogFatal(LogLevel level, const char *file, int line, const char *fmt,
                     Args &&... args) {
#ifdef PBRT_IS_GPU_CODE
    LogFatal(level, file, line, fmt);  // just the format string #yolo
#else
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    LogFatal(level, file, line, s.c_str());
#endif
}